

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  undefined1 local_310 [8];
  cmGeneratedFileStream depFileStream;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *file_local;
  cmDepends *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  if ((this->Verbose & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_68,"Clearing dependencies in \"");
    cmAlphaNum::cmAlphaNum(&local_98,local_18);
    cmStrCat<char[4]>(&local_38,&local_68,&local_98,(char (*) [4])0xdce988);
    cmSystemTools::Stdout(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_310,local_18,false,None);
  std::operator<<((ostream *)local_310,
                  "# Empty dependencies file\n# This may be replaced when dependencies are built.\n"
                 );
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_310);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file) const
{
  // Print verbose output.
  if (this->Verbose) {
    cmSystemTools::Stdout(
      cmStrCat("Clearing dependencies in \"", file, "\".\n"));
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                   "# This may be replaced when dependencies are built.\n";
}